

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall
TApp_FallThroughEquals_Test::~TApp_FallThroughEquals_Test(TApp_FallThroughEquals_Test *this)

{
  TApp_FallThroughEquals_Test *this_local;
  
  ~TApp_FallThroughEquals_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, FallThroughEquals) {
    app.fallthrough();
    int val = 1;
    app.add_option("--val", val);

    app.add_subcommand("sub");

    args = {"sub", "--val=2"};
    // Should not throw
    run();
}